

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitTableGrow(PrintExpressionContents *this,TableGrow *curr)

{
  ostream *o;
  string_view local_28;
  TableGrow *local_18;
  TableGrow *curr_local;
  PrintExpressionContents *this_local;
  
  o = this->o;
  local_18 = curr;
  curr_local = (TableGrow *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"table.grow ");
  printMedium(o,local_28);
  wasm::Name::print(&local_18->table,this->o);
  return;
}

Assistant:

void visitTableGrow(TableGrow* curr) {
    printMedium(o, "table.grow ");
    curr->table.print(o);
  }